

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_sampling.cpp
# Opt level: O2

bool dxil_spv::emit_get_dimensions_instruction(Impl *impl,CallInst *instruction)

{
  Op op;
  bool bVar1;
  byte bVar2;
  bool bVar3;
  Id IVar4;
  Id IVar5;
  Dim DVar6;
  Builder *builder;
  Value *pVVar7;
  mapped_type *pmVar8;
  Operation *this;
  Operation *pOVar9;
  Operation *this_00;
  undefined7 extraout_var;
  uint uVar10;
  mapped_type *pmVar11;
  uint i;
  uint uVar12;
  Id image_id;
  mapped_type *local_70;
  undefined4 local_68;
  uint32_t local_64;
  CallInst *local_60;
  mapped_type *local_58;
  Operation *local_50;
  undefined1 local_48 [8];
  initializer_list<unsigned_int> local_40;
  
  bVar1 = Converter::Impl::composite_is_accessed(impl,(Value *)instruction);
  if (!bVar1) {
    return true;
  }
  builder = Converter::Impl::builder(impl);
  uVar12 = 1;
  pVVar7 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,1);
  image_id = Converter::Impl::get_id_for_value(impl,pVVar7,0);
  IVar4 = Converter::Impl::get_type_id(impl,image_id);
  pmVar8 = std::__detail::
           _Map_base<unsigned_int,_std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)&impl->handle_to_resource_meta,&image_id);
  local_40._M_array = (iterator)instruction;
  local_70 = std::__detail::
             _Map_base<const_LLVMBC::Value_*,_std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::CompositeMeta>,_dxil_spv::ThreadLocalAllocator<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::CompositeMeta>_>,_std::__detail::_Select1st,_std::equal_to<const_LLVMBC::Value_*>,_std::hash<const_LLVMBC::Value_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<const_LLVMBC::Value_*,_std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::CompositeMeta>,_dxil_spv::ThreadLocalAllocator<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::CompositeMeta>_>,_std::__detail::_Select1st,_std::equal_to<const_LLVMBC::Value_*>,_std::hash<const_LLVMBC::Value_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)&impl->llvm_composite_meta,(key_type *)&local_40);
  local_64 = 0;
  IVar5 = pmVar8->index_offset_id;
  local_60 = instruction;
  local_58 = pmVar8;
  if (pmVar8->storage == StorageClassStorageBuffer) {
    IVar4 = spv::Builder::makeUintType(builder,0x20);
    if (IVar5 == 0) {
      this = Converter::Impl::allocate(impl,OpArrayLength,IVar4);
      Operation::add_id(this,image_id);
      Operation::add_literal(this,0);
      pmVar8 = local_58;
    }
    else {
      this = Converter::Impl::allocate(impl,OpCompositeExtract,IVar4);
      pmVar8 = local_58;
      Operation::add_id(this,local_58->index_offset_id);
      Operation::add_literal(this,1);
    }
    bVar2 = pmVar8->component_type + I1;
    if ((0xb < bVar2) || ((0xf51U >> (bVar2 & 0x1f) & 1) == 0)) {
      __assert_fail("0 && \"Invalid component type.\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/opcodes/converter_impl.hpp"
                    ,0x7a,"unsigned int dxil_spv::raw_component_type_to_bits(DXIL::ComponentType)");
    }
    uVar10 = (pmVar8->raw_component_vecsize + V2) * *(int *)(&DAT_001a55e4 + (ulong)bVar2 * 4) >> 3;
LAB_001607d4:
    bVar1 = false;
    local_68 = 0;
LAB_001607e3:
    Converter::Impl::add(impl,this,false);
  }
  else {
    if (IVar5 != 0) {
      uVar10 = 4;
      IVar5 = spv::Builder::makeUintType(builder,0x20);
      this = Converter::Impl::allocate(impl,OpCompositeExtract,IVar5);
      Operation::add_id(this,local_58->index_offset_id);
      Operation::add_literal(this,1);
      goto LAB_001607d4;
    }
    bVar1 = get_image_dimensions_query_size(impl,builder,image_id,&local_64);
    if (!bVar1) {
      return false;
    }
    bVar1 = spv::Builder::isStorageImageType(builder,IVar4);
    bVar3 = spv::Builder::isMultisampledImageType(builder,IVar4);
    local_68 = (undefined4)CONCAT71(extraout_var,bVar3);
    if (bVar1) {
      bVar1 = false;
    }
    else {
      DVar6 = spv::Builder::getTypeDimensionality(builder,IVar4);
      bVar1 = !bVar3 && DVar6 != DimBuffer;
    }
    pmVar11 = local_70;
    IVar5 = spv::Builder::makeUintType(builder,0x20);
    uVar12 = local_64;
    if (1 < local_64) {
      IVar5 = spv::Builder::makeVectorType(builder,IVar5,local_64);
    }
    if ((pmVar11->access_mask & 7) != 0) {
      this = Converter::Impl::allocate(impl,OpImageQuerySize - bVar1,IVar5);
      Operation::add_id(this,image_id);
      uVar10 = 4;
      if (bVar1 != false) {
        pVVar7 = LLVMBC::Instruction::getOperand(&local_60->super_Instruction,2);
        IVar5 = Converter::Impl::get_id_for_value(impl,pVVar7,0);
        Operation::add_id(this,IVar5);
        uVar10 = 4;
      }
      goto LAB_001607e3;
    }
    uVar10 = 4;
    uVar12 = 0;
    this = (Operation *)0x0;
  }
  pmVar8 = local_58;
  if (local_58->kind == StructuredBuffer) {
    IVar5 = spv::Builder::makeUintType(builder,0x20);
    local_50 = Converter::Impl::allocate(impl,OpUDiv,IVar5);
    if ((pmVar8->index_offset_id == 0) || (pmVar8->aliased == false)) {
      local_48._0_4_ = this->id;
      uVar10 = pmVar8->stride / uVar10;
    }
    else {
      local_48._0_4_ = this->id;
      uVar10 = pmVar8->stride;
    }
    local_48._4_4_ = spv::Builder::makeUintConstant(builder,uVar10,false);
    this = local_50;
    local_40._M_len = 2;
    local_40._M_array = (iterator)local_48;
    Operation::add_ids(local_50,&local_40);
    pmVar11 = local_70;
    Converter::Impl::add(impl,this,false);
  }
  else {
    pmVar11 = local_70;
    if (local_58->kind == RawBuffer) {
      IVar5 = spv::Builder::makeUintType(builder,0x20);
      pOVar9 = Converter::Impl::allocate(impl,OpIMul,IVar5);
      local_48._0_4_ = this->id;
      local_48._4_4_ = spv::Builder::makeUintConstant(builder,uVar10,false);
      local_40._M_len = 2;
      local_40._M_array = (iterator)local_48;
      Operation::add_ids(pOVar9,&local_40);
      Converter::Impl::add(impl,pOVar9,false);
      pmVar11 = local_70;
      this = pOVar9;
    }
  }
  if ((pmVar11->access_mask & 8) == 0) {
LAB_0016090f:
    pOVar9 = (Operation *)0x0;
  }
  else {
    if (bVar1 == false) {
      if ((char)local_68 == '\0') goto LAB_0016090f;
      IVar5 = spv::Builder::makeUintType(builder,0x20);
      op = OpImageQuerySamples;
    }
    else {
      IVar5 = spv::Builder::makeUintType(builder,0x20);
      op = OpImageQueryLevels;
    }
    pOVar9 = Converter::Impl::allocate(impl,op,IVar5);
    Operation::add_id(pOVar9,image_id);
    Converter::Impl::add(impl,pOVar9,false);
  }
  if (this == (Operation *)0x0 && pOVar9 == (Operation *)0x0) {
    __assert_fail("aux_op || dimensions_op",
                  "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/opcodes/dxil/dxil_sampling.cpp"
                  ,0x40e,
                  "bool dxil_spv::emit_get_dimensions_instruction(Converter::Impl &, const LLVMBC::CallInst *)"
                 );
  }
  if (pOVar9 == (Operation *)0x0 && this != (Operation *)0x0) {
    if (uVar12 == 1) {
      pmVar11->forced_composite = false;
    }
    IVar5 = this->id;
  }
  else {
    if (this != (Operation *)0x0) {
      IVar5 = spv::Builder::makeUintType(builder,0x20);
      IVar5 = spv::Builder::makeVectorType(builder,IVar5,4);
      this_00 = Converter::Impl::allocate(impl,OpCompositeConstruct,(Value *)local_60,IVar5);
      Operation::add_id(this_00,this->id);
      for (; uVar12 < 3; uVar12 = uVar12 + 1) {
        IVar5 = spv::Builder::makeUintType(builder,0x20);
        IVar5 = spv::Builder::createUndefined(builder,IVar5);
        Operation::add_id(this_00,IVar5);
      }
      Operation::add_id(this_00,pOVar9->id);
      Converter::Impl::add(impl,this_00,false);
      goto LAB_00160a89;
    }
    pmVar11->forced_composite = false;
    pmVar11->access_mask = 1;
    pmVar11->components = 1;
    IVar5 = pOVar9->id;
  }
  Converter::Impl::rewrite_value(impl,(Value *)local_60,IVar5);
LAB_00160a89:
  spv::Builder::addCapability(builder,CapabilityImageQuery);
  return true;
}

Assistant:

bool emit_get_dimensions_instruction(Converter::Impl &impl, const llvm::CallInst *instruction)
{
	if (!impl.composite_is_accessed(instruction))
		return true;

	auto &builder = impl.builder();
	spv::Id image_id = impl.get_id_for_value(instruction->getOperand(1));
	spv::Id image_type_id = impl.get_type_id(image_id);
	auto &meta = impl.handle_to_resource_meta[image_id];

	uint32_t ssbo_element_size = 4;

	Operation *dimensions_op = nullptr;
	auto &access_meta = impl.llvm_composite_meta[instruction];
	uint32_t num_coords = 0;
	bool has_samples = false;
	bool has_lod = false;

	if (meta.storage == spv::StorageClassStorageBuffer)
	{
		if (meta.index_offset_id)
		{
			dimensions_op = impl.allocate(spv::OpCompositeExtract, builder.makeUintType(32));
			dimensions_op->add_id(meta.index_offset_id);
			dimensions_op->add_literal(1);
		}
		else
		{
			dimensions_op = impl.allocate(spv::OpArrayLength, builder.makeUintType(32));
			dimensions_op->add_id(image_id);
			dimensions_op->add_literal(0);
		}

		ssbo_element_size = raw_vecsize_to_vecsize(meta.raw_component_vecsize) *
		                    raw_component_type_to_bits(meta.component_type) / 8;

		impl.add(dimensions_op);
		num_coords = 1;
	}
	else if (meta.index_offset_id)
	{
		dimensions_op = impl.allocate(spv::OpCompositeExtract, builder.makeUintType(32));
		dimensions_op->add_id(meta.index_offset_id);
		dimensions_op->add_literal(1);
		impl.add(dimensions_op);
		num_coords = 1;
	}
	else
	{
		if (!get_image_dimensions_query_size(impl, builder, image_id, &num_coords))
			return false;

		bool is_uav = builder.isStorageImageType(image_type_id);
		has_samples = builder.isMultisampledImageType(image_type_id);
		has_lod = !is_uav && builder.getTypeDimensionality(image_type_id) != spv::DimBuffer && !has_samples;

		spv::Id dim_type_id = builder.makeUintType(32);
		if (num_coords > 1)
			dim_type_id = builder.makeVectorType(dim_type_id, num_coords);

		if ((access_meta.access_mask & 7) != 0)
		{
			dimensions_op = impl.allocate(has_lod ? spv::OpImageQuerySizeLod : spv::OpImageQuerySize, dim_type_id);
			dimensions_op->add_id(image_id);
			if (has_lod)
				dimensions_op->add_id(impl.get_id_for_value(instruction->getOperand(2)));
			impl.add(dimensions_op);
		}
		else
			num_coords = 0;
	}

	if (meta.kind == DXIL::ResourceKind::RawBuffer)
	{
		Operation *byte_size_op = impl.allocate(spv::OpIMul, builder.makeUintType(32));
		byte_size_op->add_ids({ dimensions_op->id, builder.makeUintConstant(ssbo_element_size) });
		impl.add(byte_size_op);
		dimensions_op = byte_size_op;
	}
	else if (meta.kind == DXIL::ResourceKind::StructuredBuffer)
	{
		Operation *elem_count_op = impl.allocate(spv::OpUDiv, builder.makeUintType(32));

		if (meta.index_offset_id != 0)
		{
			// If the offset buffer is pre-shifted, shift the divider as well.
			if (!meta.aliased)
				elem_count_op->add_ids({ dimensions_op->id, builder.makeUintConstant(meta.stride / ssbo_element_size) });
			else
				elem_count_op->add_ids({ dimensions_op->id, builder.makeUintConstant(meta.stride) });
		}
		else
			elem_count_op->add_ids({ dimensions_op->id, builder.makeUintConstant(meta.stride / ssbo_element_size) });

		impl.add(elem_count_op);
		dimensions_op = elem_count_op;
	}

	Operation *aux_op = nullptr;
	if ((access_meta.access_mask & (1u << 3)) != 0)
	{
		if (has_lod)
		{
			aux_op = impl.allocate(spv::OpImageQueryLevels, builder.makeUintType(32));
			aux_op->add_id(image_id);
			impl.add(aux_op);
		}
		else if (has_samples)
		{
			aux_op = impl.allocate(spv::OpImageQuerySamples, builder.makeUintType(32));
			aux_op->add_id(image_id);
			impl.add(aux_op);
		}
	}

	assert(aux_op || dimensions_op);

	if (!aux_op && dimensions_op)
	{
		if (num_coords == 1)
			access_meta.forced_composite = false;
		impl.rewrite_value(instruction, dimensions_op->id);
	}
	else if (dimensions_op)
	{
		Operation *op =
		    impl.allocate(spv::OpCompositeConstruct, instruction, builder.makeVectorType(builder.makeUintType(32), 4));
		op->add_id(dimensions_op->id);

		// This element cannot be statically accessed if we don't have LOD, so don't bother returning anything here.
		// Otherwise, we need to pad out.
		for (unsigned i = num_coords; i < 3; i++)
			op->add_id(builder.createUndefined(builder.makeUintType(32)));
		op->add_id(aux_op->id);

		impl.add(op);
	}
	else
	{
		// Redirect any extract from this scalar to be preserved as-is.
		// Pretend this is a scalar even if Levels/Samples query is supposed to live in W.
		access_meta.forced_composite = false;
		access_meta.access_mask = 1;
		access_meta.components = 1;
		impl.rewrite_value(instruction, aux_op->id);
	}

	builder.addCapability(spv::CapabilityImageQuery);
	return true;
}